

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

vw * parse_args(options_i *options,trace_message_t trace_listener,void *trace_context)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  vw *pvVar5;
  parser *ppVar6;
  char *pfile;
  AllReduce *pAVar7;
  undefined8 in_RDX;
  long in_RSI;
  string *in_RDI;
  stringstream __msg;
  option_group_definition parallelization_args;
  size_t node_arg;
  size_t total_arg;
  size_t unique_id_arg;
  int span_server_port_arg;
  string span_server_arg;
  option_group_definition weight_args;
  option_group_definition update_args;
  option_group_definition vw_args;
  size_t ring_size;
  vw *all;
  string *in_stack_ffffffffffffe688;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffe690;
  string *in_stack_ffffffffffffe698;
  undefined7 in_stack_ffffffffffffe6a0;
  undefined1 in_stack_ffffffffffffe6a7;
  string *in_stack_ffffffffffffe6a8;
  undefined8 in_stack_ffffffffffffe6b0;
  allocator *ptotal;
  size_t in_stack_ffffffffffffe6b8;
  undefined4 in_stack_ffffffffffffe6c0;
  undefined2 in_stack_ffffffffffffe6c4;
  byte in_stack_ffffffffffffe6c7;
  string *in_stack_ffffffffffffe6c8;
  AllReduceSockets *in_stack_ffffffffffffe6d0;
  undefined7 in_stack_ffffffffffffe6d8;
  undefined1 in_stack_ffffffffffffe6df;
  option_group_definition *in_stack_ffffffffffffe6e0;
  string *psVar8;
  byte local_190a;
  byte local_18f2;
  size_t in_stack_ffffffffffffe798;
  vw *in_stack_ffffffffffffe7a0;
  string local_1610 [39];
  allocator local_15e9;
  string local_15e8 [39];
  undefined1 local_15c1;
  stringstream local_15a0 [16];
  ostream local_1590;
  byte local_1413;
  byte local_1412;
  undefined1 local_1411 [38];
  byte local_13eb;
  byte local_13ea;
  allocator local_13e9;
  string local_13e8 [37];
  byte local_13c3;
  byte local_13c2;
  allocator local_13c1;
  string local_13c0 [37];
  byte local_139b;
  byte local_139a;
  allocator local_1399;
  string local_1398 [37];
  byte local_1373;
  byte local_1372;
  allocator local_1371;
  string local_1370 [39];
  allocator local_1349;
  string local_1348 [39];
  allocator local_1321;
  string local_1320 [39];
  allocator local_12f9;
  string local_12f8 [176];
  vw *in_stack_ffffffffffffedb8;
  options_i *in_stack_ffffffffffffedc0;
  allocator local_1231;
  string local_1230 [39];
  allocator local_1209;
  string local_1208 [199];
  allocator local_1141;
  string local_1140 [39];
  allocator local_1119;
  string local_1118 [199];
  allocator local_1051;
  string local_1050 [39];
  allocator local_1029;
  string local_1028 [199];
  allocator local_f61;
  string local_f60 [39];
  allocator local_f39;
  string local_f38 [199];
  allocator local_e71;
  string local_e70 [32];
  undefined1 local_e50 [88];
  string local_df8 [39];
  allocator local_dd1;
  string local_dd0 [39];
  allocator local_da9;
  string local_da8 [199];
  allocator local_ce1;
  string local_ce0 [39];
  allocator local_cb9;
  string local_cb8 [199];
  allocator local_bf1;
  string local_bf0 [39];
  allocator local_bc9;
  string local_bc8 [199];
  allocator local_b01;
  string local_b00 [39];
  allocator local_ad9;
  string local_ad8 [199];
  allocator local_a11;
  string local_a10 [39];
  allocator local_9e9;
  string local_9e8 [199];
  allocator local_921;
  string local_920 [39];
  allocator local_8f9;
  string local_8f8 [199];
  allocator local_831;
  string local_830 [39];
  allocator local_809;
  string local_808 [39];
  allocator local_7e1;
  string local_7e0 [199];
  allocator local_719;
  string local_718 [32];
  undefined1 local_6f8 [63];
  allocator local_6b9;
  string local_6b8 [39];
  allocator local_691;
  string local_690 [199];
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [199];
  allocator local_4d9;
  string local_4d8 [39];
  allocator local_4b1;
  string local_4b0 [199];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [199];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [199];
  allocator local_1e1;
  string local_1e0 [32];
  undefined1 local_1c0 [63];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [199];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [80];
  vw *local_20;
  undefined8 local_18;
  long local_10;
  string *local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffe6b0 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pvVar5 = (vw *)operator_new(0x3658);
  vw::vw(in_stack_ffffffffffffe7a0);
  pvVar5->options = (options_i *)local_8;
  if (local_10 != 0) {
    *(long *)&(pvVar5->trace_message).super_ostream.field_0x80 = local_10;
    *(undefined8 *)&(pvVar5->trace_message).super_ostream.field_0x78 = local_18;
  }
  local_20 = pvVar5;
  time(&pvVar5->init_time);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"VW options",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"ring_size",&local_159);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe698,(unsigned_long *)in_stack_ffffffffffffe690);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
             (unsigned_long)in_stack_ffffffffffffe698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"size of example ring",&local_181);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (***(_func_int ***)local_8)(local_8,local_70);
  ppVar6 = (parser *)operator_new(0x398);
  parser::parser((parser *)in_stack_ffffffffffffe7a0,in_stack_ffffffffffffe798);
  local_20->p = ppVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"Update options",&local_1e1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"learning_rate",&local_2a9);
  VW::config::make_option<float>(in_stack_ffffffffffffe698,(float *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"Set learning rate",&local_2d1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"l",&local_2f9);
  VW::config::typed_option<float>::short_name
            ((typed_option<float> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<float> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"power_t",&local_3c1);
  VW::config::make_option<float>(in_stack_ffffffffffffe698,(float *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"t power value",&local_3e9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<float> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"decay_learning_rate",&local_4b1);
  VW::config::make_option<float>(in_stack_ffffffffffffe698,(float *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4d8,"Set Decay factor for learning_rate between passes",&local_4d9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<float> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"initial_t",&local_5a1);
  VW::config::make_option<double>(in_stack_ffffffffffffe698,(double *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8,"initial t value",&local_5c9);
  VW::config::typed_option<double>::help
            ((typed_option<double> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<double>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<double> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,"feature_mask",&local_691);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffe698,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6b8,
             "Use existing regressor to determine which parameters may be updated.  If no initial_regressor given, also used for initial weights."
             ,&local_6b9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  VW::config::typed_option<double>::~typed_option((typed_option<double> *)in_stack_ffffffffffffe690)
  ;
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  (***(_func_int ***)local_8)(local_8,local_1c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"Weight options",&local_719);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e0,"initial_regressor",&local_7e1);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_ffffffffffffe698,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_808,"Initial regressor(s)",&local_809);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_830,"i",&local_831);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::short_name((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8f8,"initial_weight",&local_8f9);
  VW::config::make_option<float>(in_stack_ffffffffffffe698,(float *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_920,"Set all weights to an initial value of arg.",&local_921);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<float> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"random_weights",&local_9e9);
  VW::config::make_option<bool>(in_stack_ffffffffffffe698,(bool *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a10,"make initial weights random",&local_a11);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ad8,"normal_weights",&local_ad9);
  VW::config::make_option<bool>(in_stack_ffffffffffffe698,(bool *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b00,"make initial weights normal",&local_b01);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc8,"truncated_normal_weights",&local_bc9);
  VW::config::make_option<bool>(in_stack_ffffffffffffe698,(bool *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf0,"make initial weights truncated normal",&local_bf1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cb8,"sparse_weights",&local_cb9);
  VW::config::make_option<bool>(in_stack_ffffffffffffe698,(bool *)in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ce0,"Use a sparse datastructure for weights",&local_ce1);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<bool> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_da8,"input_feature_regularizer",&local_da9);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffe698,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd0,"Per feature regularization input file",&local_dd1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::__cxx11::string::~string(local_dd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_da8);
  std::allocator<char>::~allocator((allocator<char> *)&local_da9);
  std::__cxx11::string::~string(local_ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  std::__cxx11::string::~string(local_b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_b01);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad9);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::__cxx11::string::~string(local_920);
  std::allocator<char>::~allocator((allocator<char> *)&local_921);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  std::__cxx11::string::~string(local_808);
  std::allocator<char>::~allocator((allocator<char> *)&local_809);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  (***(_func_int ***)local_8)(local_8,local_6f8);
  std::__cxx11::string::string(local_df8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e70,"Parallelization options",&local_e71);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  std::__cxx11::string::~string(local_e70);
  std::allocator<char>::~allocator((allocator<char> *)&local_e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f38,"span_server",&local_f39);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_ffffffffffffe698,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f60,"Location of server for setting up spanning tree",&local_f61);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help(in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1028,"unique_id",&local_1029);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe698,(unsigned_long *)in_stack_ffffffffffffe690);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
             (unsigned_long)in_stack_ffffffffffffe698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1050,"unique id used for cluster parallel jobs",&local_1051);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1118,"total",&local_1119);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe698,(unsigned_long *)in_stack_ffffffffffffe690);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
             (unsigned_long)in_stack_ffffffffffffe698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1140,"total number of nodes used in cluster parallel job",&local_1141);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1208,"node",&local_1209);
  VW::config::make_option<unsigned_long>
            (in_stack_ffffffffffffe698,(unsigned_long *)in_stack_ffffffffffffe690);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
             (unsigned_long)in_stack_ffffffffffffe698);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1230,"node number in cluster parallel job",&local_1231);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<unsigned_long> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12f8,"span_server_port",&local_12f9);
  VW::config::make_option<int>(in_stack_ffffffffffffe698,(int *)in_stack_ffffffffffffe690);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)CONCAT17(in_stack_ffffffffffffe6a7,in_stack_ffffffffffffe6a0),
             (int)((ulong)in_stack_ffffffffffffe698 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1320,"Port of the server for setting up spanning tree",&local_1321);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            (in_stack_ffffffffffffe6e0,
             (typed_option<int> *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::__cxx11::string::~string(local_1320);
  std::allocator<char>::~allocator((allocator<char> *)&local_1321);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_12f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12f9);
  std::__cxx11::string::~string(local_1230);
  std::allocator<char>::~allocator((allocator<char> *)&local_1231);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_1208);
  std::allocator<char>::~allocator((allocator<char> *)&local_1209);
  std::__cxx11::string::~string(local_1140);
  std::allocator<char>::~allocator((allocator<char> *)&local_1141);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_1118);
  std::allocator<char>::~allocator((allocator<char> *)&local_1119);
  std::__cxx11::string::~string(local_1050);
  std::allocator<char>::~allocator((allocator<char> *)&local_1051);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_1028);
  std::allocator<char>::~allocator((allocator<char> *)&local_1029);
  std::__cxx11::string::~string(local_f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_f61);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(in_stack_ffffffffffffe690);
  std::__cxx11::string::~string(local_f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  (***(_func_int ***)local_8)(local_8,local_e50);
  psVar8 = local_8;
  std::allocator<char>::allocator();
  local_1372 = 0;
  local_1373 = 0;
  local_139a = 0;
  local_139b = 0;
  local_13c2 = 0;
  local_13c3 = 0;
  local_13ea = 0;
  local_13eb = 0;
  local_1412 = 0;
  local_1413 = 0;
  std::__cxx11::string::string(local_1348,"total",&local_1349);
  uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_1348);
  psVar8 = local_8;
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    local_1372 = 1;
    std::__cxx11::string::string(local_1370,"node",&local_1371);
    local_1373 = 1;
    uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_1370);
    psVar8 = local_8;
    if ((uVar2 & 1) == 0) {
      std::allocator<char>::allocator();
      local_139a = 1;
      std::__cxx11::string::string(local_1398,"unique_id",&local_1399);
      local_139b = 1;
      uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_1398);
      local_18f2 = 0;
      if ((uVar2 & 1) == 0) goto LAB_001376d5;
    }
  }
  psVar8 = local_8;
  std::allocator<char>::allocator();
  local_13c2 = 1;
  std::__cxx11::string::string(local_13c0,"total",&local_13c1);
  local_13c3 = 1;
  uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_13c0);
  local_190a = 0;
  if ((uVar2 & 1) != 0) {
    psVar8 = local_8;
    std::allocator<char>::allocator();
    local_13ea = 1;
    std::__cxx11::string::string(local_13e8,"node",&local_13e9);
    local_13eb = 1;
    uVar2 = (*(*(_func_int ***)psVar8)[1])(psVar8,local_13e8);
    local_190a = 0;
    if ((uVar2 & 1) != 0) {
      in_stack_ffffffffffffe6d0 = (AllReduceSockets *)local_1411;
      in_stack_ffffffffffffe6c8 = local_8;
      std::allocator<char>::allocator();
      local_1412 = 1;
      std::__cxx11::string::string
                ((string *)(local_1411 + 1),"unique_id",(allocator *)in_stack_ffffffffffffe6d0);
      local_1413 = 1;
      iVar3 = (*(*(_func_int ***)in_stack_ffffffffffffe6c8)[1])
                        (in_stack_ffffffffffffe6c8,local_1411 + 1);
      in_stack_ffffffffffffe6c7 = (byte)iVar3;
      local_190a = in_stack_ffffffffffffe6c7;
    }
  }
  local_18f2 = local_190a ^ 0xff;
LAB_001376d5:
  if ((local_1413 & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_1411 + 1));
  }
  if ((local_1412 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_1411);
  }
  if ((local_13eb & 1) != 0) {
    std::__cxx11::string::~string(local_13e8);
  }
  if ((local_13ea & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_13e9);
  }
  if ((local_13c3 & 1) != 0) {
    std::__cxx11::string::~string(local_13c0);
  }
  if ((local_13c2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_13c1);
  }
  if ((local_139b & 1) != 0) {
    std::__cxx11::string::~string(local_1398);
  }
  if ((local_139a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1399);
  }
  if ((local_1373 & 1) != 0) {
    std::__cxx11::string::~string(local_1370);
  }
  if ((local_1372 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1371);
  }
  std::__cxx11::string::~string(local_1348);
  std::allocator<char>::~allocator((allocator<char> *)&local_1349);
  if ((local_18f2 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_15a0);
    std::operator<<(&local_1590,"you must specificy unique_id, total, and node if you specify any");
    local_15c1 = 1;
    pfile = (char *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)
               CONCAT17(in_stack_ffffffffffffe6c7,
                        CONCAT16(local_18f2,
                                 CONCAT24(in_stack_ffffffffffffe6c4,in_stack_ffffffffffffe6c0))),
               pfile,iVar4,in_stack_ffffffffffffe6a8);
    local_15c1 = 0;
    __cxa_throw(pfile,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  ptotal = &local_15e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15e8,"span_server",ptotal);
  iVar4 = (*(*(_func_int ***)local_8)[1])(local_8,local_15e8);
  bVar1 = (byte)iVar4;
  std::__cxx11::string::~string(local_15e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_15e9);
  if ((bVar1 & 1) != 0) {
    local_20->all_reduce_type = Socket;
    pAVar7 = (AllReduce *)operator_new(0x78);
    std::__cxx11::string::string(local_1610,local_df8);
    AllReduceSockets::AllReduceSockets
              (in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8,
               CONCAT13(in_stack_ffffffffffffe6c7,CONCAT12(local_18f2,in_stack_ffffffffffffe6c4)),
               in_stack_ffffffffffffe6b8,(size_t)ptotal,(size_t)local_8);
    local_20->all_reduce = pAVar7;
    std::__cxx11::string::~string(local_1610);
  }
  parse_diagnostics(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
  local_20->initial_t = (float)local_20->sd->t;
  pvVar5 = local_20;
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)local_20)
  ;
  std::__cxx11::string::~string(local_df8);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)pvVar5);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)pvVar5);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)pvVar5);
  return pvVar5;
}

Assistant:

vw& parse_args(options_i& options, trace_message_t trace_listener, void* trace_context)
{
  vw& all = *(new vw());
  all.options = &options;

  if (trace_listener)
  {
    all.trace_message.trace_listener = trace_listener;
    all.trace_message.trace_context = trace_context;
  }

  try
  {
    time(&all.init_time);

    size_t ring_size;
    option_group_definition vw_args("VW options");
    vw_args.add(make_option("ring_size", ring_size).default_value(256).help("size of example ring"));
    options.add_and_parse(vw_args);

    all.p = new parser{ring_size};

    option_group_definition update_args("Update options");
    update_args.add(make_option("learning_rate", all.eta).help("Set learning rate").short_name("l"))
        .add(make_option("power_t", all.power_t).help("t power value"))
        .add(make_option("decay_learning_rate", all.eta_decay_rate)
                 .help("Set Decay factor for learning_rate between passes"))
        .add(make_option("initial_t", all.sd->t).help("initial t value"))
        .add(make_option("feature_mask", all.feature_mask)
                 .help("Use existing regressor to determine which parameters may be updated.  If no initial_regressor "
                       "given, also used for initial weights."));
    options.add_and_parse(update_args);

    option_group_definition weight_args("Weight options");
    weight_args
        .add(make_option("initial_regressor", all.initial_regressors).help("Initial regressor(s)").short_name("i"))
        .add(make_option("initial_weight", all.initial_weight).help("Set all weights to an initial value of arg."))
        .add(make_option("random_weights", all.random_weights).help("make initial weights random"))
        .add(make_option("normal_weights", all.normal_weights).help("make initial weights normal"))
        .add(make_option("truncated_normal_weights", all.tnormal_weights).help("make initial weights truncated normal"))
        .add(make_option("sparse_weights", all.weights.sparse).help("Use a sparse datastructure for weights"))
        .add(make_option("input_feature_regularizer", all.per_feature_regularizer_input)
                 .help("Per feature regularization input file"));
    options.add_and_parse(weight_args);

    std::string span_server_arg;
    int span_server_port_arg;
    // bool threads_arg;
    size_t unique_id_arg;
    size_t total_arg;
    size_t node_arg;
    option_group_definition parallelization_args("Parallelization options");
    parallelization_args
        .add(make_option("span_server", span_server_arg).help("Location of server for setting up spanning tree"))
        //(make_option("threads", threads_arg).help("Enable multi-threading")) Unused option?
        .add(make_option("unique_id", unique_id_arg).default_value(0).help("unique id used for cluster parallel jobs"))
        .add(
            make_option("total", total_arg).default_value(1).help("total number of nodes used in cluster parallel job"))
        .add(make_option("node", node_arg).default_value(0).help("node number in cluster parallel job"))
        .add(make_option("span_server_port", span_server_port_arg).default_value(26543)
          .help("Port of the server for setting up spanning tree"));
    options.add_and_parse(parallelization_args);

    // total, unique_id and node must be specified together.
    if ((options.was_supplied("total") || options.was_supplied("node") || options.was_supplied("unique_id")) &&
        !(options.was_supplied("total") && options.was_supplied("node") && options.was_supplied("unique_id")))
    {
      THROW("you must specificy unique_id, total, and node if you specify any");
    }

    if (options.was_supplied("span_server"))
    {
      all.all_reduce_type = AllReduceType::Socket;
      all.all_reduce = new AllReduceSockets(span_server_arg, span_server_port_arg, unique_id_arg, total_arg, node_arg);
    }

    parse_diagnostics(options, all);

    all.initial_t = (float)all.sd->t;
    return all;
  }
  catch (...)
  {
    VW::finish(all);
    throw;
  }
}